

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O3

iterator_range<llvm::SmallPtrSetIterator<llvm::cl::SubCommand_*>_> *
llvm::cl::getRegisteredSubcommands(void)

{
  uint *puVar1;
  long lVar2;
  atomic<void_*> aVar3;
  void **ppvVar4;
  void **ppvVar5;
  uint *puVar6;
  iterator_range<llvm::SmallPtrSetIterator<llvm::cl::SubCommand_*>_> *in_RDI;
  uint *puVar7;
  SmallPtrSetIteratorImpl local_38;
  
  if (GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p == (__pointer_type)0x0) {
    ManagedStaticBase::RegisterManagedStatic
              (&GlobalParser.super_ManagedStaticBase,
               object_creator<(anonymous_namespace)::CommandLineParser>::call,
               object_deleter<(anonymous_namespace)::CommandLineParser>::call);
  }
  aVar3._M_b._M_p = GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p;
  local_38.Bucket = *(void ***)((long)GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p + 0xf0);
  puVar1 = (uint *)((long)GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p + 0xfc);
  puVar7 = (uint *)((long)GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p + 0xf8);
  puVar6 = puVar7;
  if (local_38.Bucket ==
      *(void ***)((long)GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p + 0xe8)) {
    puVar6 = puVar1;
  }
  local_38.End = local_38.Bucket + *puVar6;
  SmallPtrSetIteratorImpl::AdvanceIfNotValid(&local_38);
  ppvVar5 = local_38.End;
  ppvVar4 = local_38.Bucket;
  lVar2 = *(long *)((long)aVar3._M_b._M_p + 0xf0);
  if (lVar2 == *(long *)((long)aVar3._M_b._M_p + 0xe8)) {
    puVar7 = puVar1;
  }
  local_38.Bucket = (void **)(lVar2 + (ulong)*puVar7 * 8);
  local_38.End = local_38.Bucket;
  SmallPtrSetIteratorImpl::AdvanceIfNotValid(&local_38);
  (in_RDI->begin_iterator).super_SmallPtrSetIteratorImpl.Bucket = ppvVar4;
  (in_RDI->begin_iterator).super_SmallPtrSetIteratorImpl.End = ppvVar5;
  (in_RDI->end_iterator).super_SmallPtrSetIteratorImpl.Bucket = local_38.Bucket;
  (in_RDI->end_iterator).super_SmallPtrSetIteratorImpl.End = local_38.End;
  return in_RDI;
}

Assistant:

iterator_range<typename SmallPtrSet<SubCommand *, 4>::iterator>
cl::getRegisteredSubcommands() {
  return GlobalParser->getRegisteredSubcommands();
}